

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall
ON_NurbsCage::Create
          (ON_NurbsCage *this,int dim,bool is_rat,int order0,int order1,int order2,int cv_count0,
          int cv_count1,int cv_count2)

{
  char *sFormat;
  int iVar1;
  
  Destroy(this);
  if ((order1 < 2 || order0 < 2) || order2 < 2) {
    if ((dim == 0) &&
       ((((((order1 == 0 && order0 == 0) && order2 == 0) && cv_count0 == 0) && cv_count1 == 0) &&
        cv_count2 == 0) && !is_rat)) {
      return true;
    }
    sFormat = "ON_NurbsCage::Create - invalid orders";
    iVar1 = 0x31d;
  }
  else if ((cv_count1 < order1 || cv_count0 < order0) || cv_count2 < order2) {
    sFormat = "ON_NurbsCage::Create - invalid cv counts";
    iVar1 = 0x323;
  }
  else {
    if (0 < dim) {
      this->m_dim = dim;
      this->m_is_rat = is_rat;
      this->m_order[0] = order0;
      this->m_order[1] = order1;
      this->m_order[2] = order2;
      this->m_cv_count[0] = cv_count0;
      this->m_cv_count[1] = cv_count1;
      this->m_cv_count[2] = cv_count2;
      this->m_cv_stride[2] = (uint)is_rat + dim;
      iVar1 = ((uint)is_rat + dim) * cv_count2;
      this->m_cv_stride[1] = iVar1;
      iVar1 = iVar1 * cv_count1;
      this->m_cv_stride[0] = iVar1;
      ReserveCVCapacity(this,iVar1 * cv_count0);
      iVar1 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
      ReserveKnotCapacity(this,0,iVar1);
      iVar1 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
      ReserveKnotCapacity(this,1,iVar1);
      iVar1 = ON_KnotCount(this->m_order[2],this->m_cv_count[2]);
      ReserveKnotCapacity(this,2,iVar1);
      ON_MakeClampedUniformKnotVector(this->m_order[0],this->m_cv_count[0],this->m_knot[0],1.0);
      ON_MakeClampedUniformKnotVector(this->m_order[1],this->m_cv_count[1],this->m_knot[1],1.0);
      ON_MakeClampedUniformKnotVector(this->m_order[2],this->m_cv_count[2],this->m_knot[2],1.0);
      ON_SetKnotVectorDomain(this->m_order[0],this->m_cv_count[0],this->m_knot[0],0.0,1.0);
      ON_SetKnotVectorDomain(this->m_order[1],this->m_cv_count[1],this->m_knot[1],0.0,1.0);
      ON_SetKnotVectorDomain(this->m_order[2],this->m_cv_count[2],this->m_knot[2],0.0,1.0);
      iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
      return SUB41(iVar1,0);
    }
    sFormat = "ON_NurbsCage::Create - invalid dim";
    iVar1 = 0x329;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
             ,iVar1,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsCage::Create( int dim, bool is_rat, 
                            int order0, int order1, int order2,
                            int cv_count0, int cv_count1, int cv_count2 
                            )
{
  Destroy();
  if ( order0 < 2 || order1 < 2 || order2 < 2 )
  {
    if (   0 == dim && 0 == is_rat 
         && 0 == order0 && 0 == order1 && 0 == order2 
         && 0 == cv_count0 && 0 == cv_count1 && 0 == cv_count2 )
    {
      return true;
    }
    ON_ERROR("ON_NurbsCage::Create - invalid orders");
    return false;
  }

  if ( cv_count0 < order0 || cv_count1 < order1 || cv_count2 < order2 )
  {
    ON_ERROR("ON_NurbsCage::Create - invalid cv counts");
    return false;
  }

  if ( dim < 1 )
  {
    ON_ERROR("ON_NurbsCage::Create - invalid dim");
    return false;
  }

  if ( is_rat != true && is_rat != false )
  {
    ON_ERROR("ON_NurbsCage::Create - invalid is_rat");
    return false;
  }

  m_dim = dim;
  m_is_rat = is_rat ? 1 : 0;
  
  m_order[0] = order0;
  m_order[1] = order1;
  m_order[2] = order2;
  
  m_cv_count[0] = cv_count0;
  m_cv_count[1] = cv_count1;
  m_cv_count[2] = cv_count2;
  
  // Other ON_NurbsCage member functions, like operator=,
  // depend on the strides being set this way.  If you anything
  // in the next three lines, then you need to read all the
  // code in the ON_NurbsCage member functions and adjust
  // it accordingly.
  m_cv_stride[2] = m_dim+m_is_rat;
  m_cv_stride[1] = m_cv_stride[2]*m_cv_count[2];
  m_cv_stride[0] = m_cv_stride[1]*m_cv_count[1];
  
  ReserveCVCapacity(m_cv_stride[0]*m_cv_count[0]);
  
  ReserveKnotCapacity(0,ON_KnotCount(m_order[0],m_cv_count[0]));
  ReserveKnotCapacity(1,ON_KnotCount(m_order[1],m_cv_count[1]));
  ReserveKnotCapacity(2,ON_KnotCount(m_order[2],m_cv_count[2]));
  
  ON_MakeClampedUniformKnotVector(m_order[0],m_cv_count[0],m_knot[0],1.0);
  ON_MakeClampedUniformKnotVector(m_order[1],m_cv_count[1],m_knot[1],1.0);
  ON_MakeClampedUniformKnotVector(m_order[2],m_cv_count[2],m_knot[2],1.0);

  ON_SetKnotVectorDomain( m_order[0], m_cv_count[0], m_knot[0], 0.0, 1.0);
  ON_SetKnotVectorDomain( m_order[1], m_cv_count[1], m_knot[1], 0.0, 1.0);
  ON_SetKnotVectorDomain( m_order[2], m_cv_count[2], m_knot[2], 0.0, 1.0);
  
  return IsValid() ? true : false;
}